

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O1

void If_Dec7MinimumBase(word *uTruth,int *pSupp,int nVarsAll,int *pnVars)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  word wVar12;
  word *pwVar13;
  word *pwVar14;
  bool bVar15;
  int local_4c;
  
  if (7 < nVarsAll) {
    __assert_fail("nVarsAll <= 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                  ,0x223,"void If_Dec7MinimumBase(word *, int *, int, int *)");
  }
  if (nVarsAll < 1) {
    local_4c = 0;
    uVar8 = 0;
  }
  else {
    uVar10 = *uTruth;
    uVar11 = 0;
    pwVar13 = Truth6;
    uVar8 = 0;
    local_4c = 0;
    do {
      if (uVar11 == 6) {
        bVar15 = uVar10 == uTruth[1];
LAB_0041307b:
        if (!bVar15) goto LAB_00413082;
      }
      else {
        uVar2 = *pwVar13;
        bVar7 = (byte)(1 << ((byte)uVar11 & 0x1f));
        if ((uVar2 & uVar10) >> (bVar7 & 0x3f) == (uVar10 & ~uVar2)) {
          bVar15 = (uVar2 & uTruth[1]) >> (bVar7 & 0x3f) == (~uVar2 & uTruth[1]);
          goto LAB_0041307b;
        }
LAB_00413082:
        if (pSupp != (int *)0x0) {
          pSupp[local_4c] = pSupp[uVar11];
        }
        uVar8 = uVar8 | 1 << ((uint)uVar11 & 0x1f);
        local_4c = local_4c + 1;
      }
      uVar11 = uVar11 + 1;
      pwVar13 = pwVar13 + 1;
    } while ((uint)nVarsAll != uVar11);
  }
  if (pnVars != (int *)0x0) {
    *pnVars = local_4c;
  }
  if ((uVar8 + 1 & uVar8) != 0) {
    if (nVarsAll < 1) {
      iVar9 = 0;
    }
    else {
      uVar10 = 0;
      pwVar13 = Truth7[6] + 1;
      iVar9 = 0;
      do {
        if ((uVar8 >> ((uint)uVar10 & 0x1f) & 1) != 0) {
          if (iVar9 < (int)(uint)uVar10) {
            uVar11 = uVar10;
            pwVar14 = pwVar13;
            do {
              if (uVar11 == 6) {
                uVar1 = *(uint *)((long)uTruth + 4);
                *(int *)((long)uTruth + 4) = (int)uTruth[1];
                wVar12 = uTruth[1] & 0xffffffff00000000 | (ulong)uVar1;
              }
              else {
                if (5 < (long)uVar11) {
                  __assert_fail("v < 5",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                                ,0x10a,"void If_Dec7SwapAdjacent(word *, int)");
                }
                uVar2 = pwVar14[-2];
                uVar3 = (*(word (*) [2])(pwVar14 + -1))[0];
                uVar4 = *uTruth;
                bVar7 = (byte)(1 << ((char)uVar11 - 1U & 0x1f));
                uVar5 = *pwVar14;
                uVar6 = uTruth[1];
                *uTruth = (uVar4 & uVar5) >> (bVar7 & 0x3f) |
                          (uVar3 & uVar4) << (bVar7 & 0x3f) | uVar2 & uVar4;
                wVar12 = (uVar6 & uVar5) >> (bVar7 & 0x3f) |
                         (uVar3 & uVar6) << (bVar7 & 0x3f) | uVar2 & uVar6;
              }
              uVar11 = uVar11 - 1;
              uTruth[1] = wVar12;
              pwVar14 = pwVar14 + -3;
            } while ((long)iVar9 < (long)uVar11);
          }
          iVar9 = iVar9 + 1;
        }
        uVar10 = uVar10 + 1;
        pwVar13 = pwVar13 + 3;
      } while (uVar10 != (uint)nVarsAll);
    }
    if (iVar9 != local_4c) {
      __assert_fail("Var == nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                    ,0x21e,"void If_Dec7TruthShrink(word *, int, int, unsigned int)");
    }
  }
  return;
}

Assistant:

void If_Dec7MinimumBase( word uTruth[2], int * pSupp, int nVarsAll, int * pnVars )
{
    int v, iVar = 0, uSupp = 0;
    assert( nVarsAll <= 7 );
    for ( v = 0; v < nVarsAll; v++ )
        if ( If_Dec7HasVar( uTruth, v ) )
        {
            uSupp |= (1 << v);
            if ( pSupp )
                pSupp[iVar] = pSupp[v];
            iVar++;
        }
    if ( pnVars )
        *pnVars = iVar;
    if ( If_DecSuppIsMinBase( uSupp ) )
        return;
    If_Dec7TruthShrink( uTruth, iVar, nVarsAll, uSupp );
}